

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

void duckdb::IntegralCompressFunction<duckdb::uhugeint_t,unsigned_long>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  uint64_t *puVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  allocate_function_ptr_t p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uhugeint_t *ldata;
  byte bVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  SelectionVector *pSVar8;
  reference pvVar9;
  VectorBuffer *pVVar10;
  ulong uVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  idx_t idx_in_entry;
  ulong uVar14;
  idx_t iVar15;
  uhugeint_t uVar16;
  uhugeint_t min_val;
  optional_idx dict_size;
  duckdb dVar17;
  element_type *in_stack_ffffffffffffff38;
  element_type *peVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  uhugeint_t *local_b0;
  uhugeint_t local_a8;
  idx_t local_90;
  uhugeint_t *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  local_a8.lower = *(uint64_t *)pvVar9->data;
  local_a8.upper = *(uint64_t *)((long)pvVar9->data + 8);
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar1 = pvVar9->vector_type;
  local_b0 = &local_a8;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    dVar17 = SUB81(in_stack_ffffffffffffff38,0);
    puVar4 = (unsigned_long *)result->data;
    ldata = (uhugeint_t *)pvVar9->data;
    FlatVector::VerifyFlatVector(pvVar9);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<duckdb::uhugeint_t,unsigned_long,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::uhugeint_t,unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::uhugeint_t_const&)_1_>
              (ldata,puVar4,count,&pvVar9->validity,&result->validity,&local_b0,(bool)dVar17);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(pvVar9);
      pVVar10 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar9->buffer);
      local_78.sel = (SelectionVector *)pVVar10[1].data.allocator.ptr;
      if (((Allocator *)local_78.sel != (Allocator *)0xffffffffffffffff) &&
         (iVar15 = optional_idx::GetIndex((optional_idx *)&local_78), iVar15 * 2 <= count)) {
        DictionaryVector::VerifyDictionary(pvVar9);
        pVVar10 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar9->auxiliary);
        if (*(char *)&pVVar10[1]._vptr_VectorBuffer == '\0') {
          puVar4 = (unsigned_long *)result->data;
          local_88 = (uhugeint_t *)pVVar10[1].data.pointer;
          local_90 = optional_idx::GetIndex((optional_idx *)&local_78);
          dVar17 = SUB81(in_stack_ffffffffffffff38,0);
          FlatVector::VerifyFlatVector((Vector *)(pVVar10 + 1));
          FlatVector::VerifyFlatVector(result);
          UnaryExecutor::
          ExecuteFlat<duckdb::uhugeint_t,unsigned_long,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::uhugeint_t,unsigned_long>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::uhugeint_t_const&)_1_>
                    (local_88,puVar4,local_90,(ValidityMask *)&pVVar10[1].data.allocated_size,
                     &result->validity,&local_b0,(bool)dVar17);
          DictionaryVector::VerifyDictionary(pvVar9);
          pVVar10 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar9->buffer);
          iVar15 = optional_idx::GetIndex((optional_idx *)&local_78);
          Vector::Dictionary(result,result,iVar15,(SelectionVector *)(pVVar10 + 1),count);
          return;
        }
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar2 = (uint64_t *)result->data;
      pdVar3 = pvVar9->data;
      puVar4 = (pvVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      local_78.sel = *(SelectionVector **)pdVar3;
      local_78.data = *(data_ptr_t *)(pdVar3 + 8);
      uVar16 = uhugeint_t::operator-((uhugeint_t *)&local_78,&local_a8);
      *puVar2 = uVar16.lower;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(pvVar9,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar8 = local_78.sel;
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        iVar15 = 0;
        do {
          uVar16 = uhugeint_t::operator-((uhugeint_t *)&stack0xffffffffffffff38,&local_a8);
          *(uint64_t *)(pdVar3 + iVar15 * 8) = uVar16.lower;
          iVar15 = iVar15 + 1;
        } while (count != iVar15);
      }
    }
    else if (count != 0) {
      p_Var5 = (allocate_function_ptr_t)pSVar8->sel_vector;
      uVar14 = 0;
      do {
        p_Var7 = p_Stack_c0;
        uVar11 = uVar14;
        if (p_Var5 != (allocate_function_ptr_t)0x0) {
          uVar11 = (ulong)*(uint *)(p_Var5 + uVar14 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar11 >> 6]
             >> (uVar11 & 0x3f) & 1) == 0) {
          _Var13._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          peVar18 = in_stack_ffffffffffffff38;
          if (_Var13._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&stack0xffffffffffffff38,&local_80);
            peVar18 = (element_type *)0x0;
            p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = in_stack_ffffffffffffff38;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var13._M_head_impl =
                 (pTVar12->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var13._M_head_impl;
          }
          bVar6 = (byte)uVar14 & 0x3f;
          _Var13._M_head_impl[uVar14 >> 6] =
               _Var13._M_head_impl[uVar14 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        else {
          peVar18 = *(element_type **)(local_78.data + uVar11 * 0x10);
          p_Stack_c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                        (local_78.data + uVar11 * 0x10 + 8);
          uVar16 = uhugeint_t::operator-((uhugeint_t *)&stack0xffffffffffffff38,&local_a8);
          *(uint64_t *)(pdVar3 + uVar14 * 8) = uVar16.lower;
        }
        uVar14 = uVar14 + 1;
        in_stack_ffffffffffffff38 = peVar18;
      } while (count != uVar14);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}